

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O3

char * plugin_print_info(void)

{
  return 
  "Plugin Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *plugin_print_info(void)
{
	static const char plugin_info[] =
		"Plugin Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef PLUGIN_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return plugin_info;
}